

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.h
# Opt level: O3

int __thiscall google::protobuf::StringPiece::compare(StringPiece *this,StringPiece x)

{
  size_t sVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  size_t __n;
  
  sVar4 = x.length_;
  sVar1 = this->length_;
  __n = sVar4;
  if ((long)sVar1 < (long)sVar4) {
    __n = sVar1;
  }
  iVar2 = memcmp(this->ptr_,x.ptr_,__n);
  uVar3 = 0xffffffff;
  if (-1 < iVar2) {
    if ((long)sVar1 < (long)sVar4 || iVar2 != 0) {
      uVar3 = (uint)(iVar2 != 0) * 2 - 1;
    }
    else {
      uVar3 = (uint)((long)sVar4 < (long)sVar1);
    }
  }
  return uVar3;
}

Assistant:

int compare(StringPiece x) const {
    const stringpiece_ssize_type min_size =
        length_ < x.length_ ? length_ : x.length_;
    int r = memcmp(ptr_, x.ptr_, static_cast<size_t>(min_size));
    if (r < 0) return -1;
    if (r > 0) return 1;
    if (length_ < x.length_) return -1;
    if (length_ > x.length_) return 1;
    return 0;
  }